

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_INT *pRVar3;
  REF_GLOB *pRVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  REF_INT *node_part;
  long lVar7;
  void *pvVar8;
  undefined8 uVar9;
  uint npart;
  ulong uVar10;
  char *pcVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  REF_INT max_age;
  REF_INT age;
  int local_5c;
  REF_MPI local_58;
  void *local_50;
  REF_NODE local_48;
  size_t local_40;
  int local_34;
  long lVar15;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar6 = ref_node_synchronize_globals(ref_node);
  if (uVar6 != 0) {
    pcVar11 = "sync global nodes";
    uVar9 = 0x6cd;
    goto LAB_0020b9cc;
  }
  uVar6 = ref_node_collect_ghost_age(ref_node);
  if (uVar6 != 0) {
    pcVar11 = "collect ghost age";
    uVar9 = 0x6ce;
    goto LAB_0020b9cc;
  }
  if (ref_grid->partitioner_full == 0) {
    local_5c = 0;
    if ((long)ref_node->max < 1) {
      local_34 = 0;
    }
    else {
      uVar10 = 0;
      local_34 = 0;
      do {
        if ((-1 < ref_node->global[uVar10]) &&
           (iVar13 = ref_node->age[uVar10], local_5c = local_34, local_34 <= iVar13)) {
          local_34 = iVar13;
          local_5c = iVar13;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)(long)ref_node->max);
    }
    uVar6 = ref_mpi_max(ref_mpi,&local_34,&local_5c,1);
    if (uVar6 != 0) {
      pcVar11 = "mpi max";
      uVar9 = 0x6d8;
      goto LAB_0020b9cc;
    }
    uVar6 = ref_mpi_bcast(ref_mpi,&local_5c,1,1);
    if (uVar6 != 0) {
      pcVar11 = "min";
      uVar9 = 0x6d9;
      goto LAB_0020b9cc;
    }
    uVar10 = 1000;
    if (1000 < local_5c * 10) {
      uVar10 = (ulong)(uint)(local_5c * 10);
    }
    uVar6 = (uint)(ref_node->old_n_global / (long)uVar10);
    npart = 1;
    if (1 < (int)uVar6) {
      npart = uVar6;
    }
    if (ref_mpi->n < (int)npart) {
      npart = ref_mpi->n;
    }
  }
  else {
    npart = ref_mpi->n;
  }
  uVar6 = ref_node->max;
  if ((long)(int)uVar6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e0
           ,"ref_migrate_to_balance","malloc node_part of REF_INT negative");
    return 1;
  }
  node_part = (REF_INT *)malloc((long)(int)uVar6 * 4);
  auVar5 = _DAT_0020f560;
  if (node_part == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e0
           ,"ref_migrate_to_balance","malloc node_part of REF_INT NULL");
    return 2;
  }
  if (uVar6 != 0) {
    lVar7 = (ulong)uVar6 - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar12 = auVar12 ^ _DAT_0020f560;
    auVar14 = _DAT_0020f540;
    auVar16 = _DAT_0020f550;
    do {
      auVar17 = auVar16 ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                  iVar13 < auVar17._4_4_) & 1)) {
        *(undefined4 *)((long)node_part + lVar7) = 0xffffffff;
      }
      if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
          auVar17._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)node_part + lVar7 + 4) = 0xffffffff;
      }
      auVar17 = auVar14 ^ auVar5;
      iVar18 = auVar17._4_4_;
      if (iVar18 <= iVar13 && (iVar18 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)node_part + lVar7 + 8) = 0xffffffff;
        *(undefined4 *)((long)node_part + lVar7 + 0xc) = 0xffffffff;
      }
      lVar15 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar15 + 4;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar15 + 4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uVar6 + 3 >> 2) << 4 != lVar7);
  }
  if (((int)npart < 2) || (ref_grid->mpi->n < 2)) {
    ref_migrate_single_part(ref_grid,node_part);
LAB_0020bcdb:
    uVar6 = ref_node_ghost_int(ref_node,node_part,1);
    if (uVar6 == 0) {
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"migrate: new part");
      }
      if (ref_grid->interp == (REF_INTERP)0x0) {
        if (0 < ref_node->max) {
          pRVar3 = ref_node->part;
          lVar7 = 0;
          do {
            pRVar3[lVar7] = node_part[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 < ref_node->max);
        }
        uVar6 = ref_migrate_shufflin(ref_grid);
        if (uVar6 == 0) {
          pcVar11 = "shuffle primal";
          goto LAB_0020c039;
        }
        pcVar11 = "shufflin";
        uVar9 = 0x6ef;
      }
      else {
        uVar6 = ref_interp_from_part(ref_grid->interp,node_part);
        if (uVar6 == 0) {
          pcVar11 = "shuffle primal back";
LAB_0020c039:
          ref_mpi_stopwatch_stop(ref_grid->mpi,pcVar11);
          free(node_part);
          return 0;
        }
        pcVar11 = "from part";
        uVar9 = 0x6e9;
      }
    }
    else {
      pcVar11 = "ghost part";
      uVar9 = 0x6e3;
    }
  }
  else {
    switch(ref_grid->partitioner) {
    case REF_MIGRATE_RECOMMENDED:
    case REF_MIGRATE_PARMETIS:
    case REF_MIGRATE_ZOLTAN_GRAPH:
    case REF_MIGRATE_ZOLTAN_RCB:
      uVar6 = ref_migrate_native_rcb_part(ref_grid,npart,node_part);
      if (uVar6 == 0) break;
      pcVar11 = "single by method";
      uVar9 = 0x551;
      goto LAB_0020bff9;
    case REF_MIGRATE_SINGLE:
      ref_migrate_single_part(ref_grid,node_part);
      break;
    case REF_MIGRATE_NATIVE_RCB:
      uVar6 = ref_migrate_native_rcb_part(ref_grid,npart,node_part);
      if (uVar6 != 0) {
        pcVar11 = "single by method";
        uVar9 = 0x537;
        goto LAB_0020bff9;
      }
      break;
    default:
      if (ref_grid->mpi->id == 0) {
        printf("requested partitioner method %d is not recognized or configured\n");
      }
      pcVar11 = "ref_migrate_method";
      uVar6 = 6;
      uVar9 = 0x55b;
      uVar10 = 6;
      goto LAB_0020bffc;
    }
    uVar6 = ref_grid->mpi->n;
    if ((long)(int)uVar6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x112,"ref_migrate_report_load_balance","malloc partition_size of REF_INT negative");
LAB_0020bfa2:
      uVar6 = 1;
    }
    else {
      local_48 = ref_grid->node;
      local_40 = (long)(int)uVar6 * 4;
      local_58 = ref_grid->mpi;
      pvVar8 = malloc(local_40);
      if (pvVar8 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x112,"ref_migrate_report_load_balance","malloc partition_size of REF_INT NULL");
        uVar6 = 2;
      }
      else {
        local_50 = pvVar8;
        if (uVar6 != 0) {
          memset(pvVar8,0,local_40);
        }
        iVar13 = local_48->max;
        if (0 < (long)iVar13) {
          pRVar4 = local_48->global;
          uVar10 = 0;
          do {
            if ((-1 < pRVar4[uVar10]) && (local_48->ref_mpi->id == local_48->part[uVar10])) {
              if (uVar6 <= (uint)node_part[uVar10]) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x11a,"ref_migrate_report_load_balance","part out of range");
                printf("rank %d node %d node_part %d n %d",(ulong)(uint)local_58->id,
                       uVar10 & 0xffffffff,(ulong)(uint)node_part[uVar10],(ulong)(uint)local_58->n);
                goto LAB_0020bfa2;
              }
              piVar1 = (int *)((long)local_50 + (ulong)(uint)node_part[uVar10] * 4);
              *piVar1 = *piVar1 + 1;
            }
            uVar10 = uVar10 + 1;
          } while ((long)iVar13 != uVar10);
        }
        uVar6 = ref_mpi_allsum(local_58,local_50,uVar6,1);
        pvVar8 = local_50;
        if (uVar6 == 0) {
          iVar13 = 0x7fffffff;
          uVar10 = 0;
          iVar18 = 0;
          do {
            iVar2 = *(int *)((long)local_50 + uVar10 * 4);
            if (iVar2 <= iVar13) {
              iVar13 = iVar2;
            }
            if (iVar2 < iVar18) {
              iVar2 = iVar18;
            }
            iVar18 = iVar2;
            uVar10 = uVar10 + 1;
          } while (npart != uVar10);
          if (local_58->id == 0) {
            printf("balance %6.3f on %d of %d target %d size min %d max %d\n",
                   (double)(int)npart * ((double)iVar18 / (double)local_48->old_n_global),
                   (ulong)npart,(ulong)(uint)local_58->n);
          }
          free(pvVar8);
          goto LAB_0020bcdb;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x11f,"ref_migrate_report_load_balance",(ulong)uVar6,"allsum");
      }
    }
    pcVar11 = "report bal";
    uVar9 = 0x55f;
LAB_0020bff9:
    uVar10 = (ulong)uVar6;
LAB_0020bffc:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9
           ,"ref_migrate_new_part",uVar10,pcVar11);
    pcVar11 = "new part";
    uVar9 = 0x6e2;
  }
LAB_0020b9cc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9,
         "ref_migrate_to_balance",(ulong)uVar6,pcVar11);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT npart;
  REF_INT node, age, max_age;
  REF_INT node_per_core, heuristic;
  REF_INT *node_part;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");
  RSS(ref_node_collect_ghost_age(ref_node), "collect ghost age");
  if (ref_grid_partitioner_full(ref_grid)) {
    npart = ref_mpi_n(ref_mpi);
  } else {
    /* heuristic to reduce the number of active cores when over decomposed */
    max_age = 0;
    each_ref_node_valid_node(ref_node, node) {
      max_age = MAX(max_age, ref_node_age(ref_node, node));
    }
    age = max_age;
    RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");
    node_per_core = MAX(1000, 10 * max_age);
    heuristic = MAX(
        1, (REF_INT)(ref_node_n_global(ref_node) / (REF_GLOB)node_per_core));
    npart = MIN(ref_mpi_n(ref_mpi), heuristic);
  }

  ref_malloc_init(node_part, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  RSS(ref_migrate_new_part(ref_grid, npart, node_part), "new part");
  RSS(ref_node_ghost_int(ref_node, node_part, 1), "ghost part");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "migrate: new part");

  if (NULL != ref_grid_interp(ref_grid)) {
    RSS(ref_interp_from_part(ref_grid_interp(ref_grid), node_part),
        "from part");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal back");
  } else {
    for (node = 0; node < ref_node_max(ref_node); node++)
      ref_node_part(ref_node, node) = node_part[node];

    RSS(ref_migrate_shufflin(ref_grid), "shufflin");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal");
  }
  ref_free(node_part);

  return REF_SUCCESS;
}